

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

int next_cache_entry(archive_read *a,iso9660 *iso9660,file_info **pfile)

{
  heap_queue *heap;
  int *piVar1;
  anon_struct_16_2_ec647c9d_for_cache_files *paVar2;
  anon_struct_16_2_ec647c9d_for_re_files *paVar3;
  anon_struct_16_2_ec647c9d_for_rede_files *paVar4;
  file_info ***pppfVar5;
  byte *pbVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  uint64_t uVar10;
  file_info *pfVar11;
  void *pvVar12;
  ulong uVar13;
  uint64_t uVar14;
  undefined8 *puVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  undefined8 uVar19;
  file_info *pfVar20;
  byte *isodirrec;
  byte *pbVar21;
  file_info *pfVar22;
  content *pcVar23;
  void *pvVar24;
  file_info ***pppfVar25;
  byte bVar26;
  size_t sVar27;
  uchar *p;
  char *fmt;
  char cVar28;
  ulong uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  file_info *pfVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  size_t min;
  bool bVar38;
  anon_struct_16_2_ec647c9d empty_files;
  uint local_84;
  ulong local_80;
  file_info *local_78;
  file_info *local_58;
  file_info **appfStack_50 [2];
  heap_queue *local_40;
  size_t local_38;
  
  paVar2 = &iso9660->cache_files;
  pfVar20 = (iso9660->cache_files).first;
  if (pfVar20 != (file_info *)0x0) {
    pfVar22 = pfVar20->next;
    paVar2->first = pfVar22;
    if (pfVar22 == (file_info *)0x0) {
      (iso9660->cache_files).last = &paVar2->first;
    }
    if (pfVar20 != (file_info *)0x0) {
      *pfile = pfVar20;
      return 0;
    }
  }
  heap = &iso9660->pending_files;
  paVar3 = &iso9660->re_files;
  do {
    pfVar20 = heap_get_entry(heap);
    *pfile = pfVar20;
    if (pfVar20 == (file_info *)0x0) {
      if (((paVar3->first != (file_info *)0x0) &&
          (pfVar20 = iso9660->rr_moved, pfVar20 != (file_info *)0x0)) &&
         (pfVar20->rr_moved_has_re_only != '\0')) {
        pfVar20->next = (file_info *)0x0;
        *(iso9660->cache_files).last = pfVar20;
        (iso9660->cache_files).last = &pfVar20->next;
      }
LAB_00428383:
      pfVar20 = paVar3->first;
      if (pfVar20 != (file_info *)0x0) {
        pfVar22 = pfVar20->re_next;
        paVar3->first = pfVar22;
        if (pfVar22 == (file_info *)0x0) {
          (iso9660->re_files).last = &paVar3->first;
        }
        if (pfVar20 == (file_info *)0x0) goto LAB_004283a8;
        pfVar22 = (pfVar20->rede_files).first;
        bVar38 = pfVar22 == (file_info *)0x0;
        if (!bVar38) {
          paVar4 = &pfVar20->rede_files;
          do {
            pfVar11 = pfVar22->re_next;
            paVar4->first = pfVar11;
            if (pfVar11 == (file_info *)0x0) {
              (pfVar20->rede_files).last = &paVar4->first;
            }
            if (bVar38) break;
            pfVar22->next = (file_info *)0x0;
            *(iso9660->cache_files).last = pfVar22;
            (iso9660->cache_files).last = &pfVar22->next;
            pfVar22 = paVar4->first;
            bVar38 = pfVar22 == (file_info *)0x0;
          } while (!bVar38);
        }
        goto LAB_00428383;
      }
LAB_004283a8:
      cVar28 = '\x01';
      if (paVar2->first == (file_info *)0x0) {
        local_84 = 1;
      }
      else {
        local_84 = next_cache_entry(a,iso9660,pfile);
      }
      pfVar20 = (file_info *)0x0;
    }
    else {
      uVar10 = pfVar20->cl_offset;
      if (uVar10 == 0) {
        if ((pfVar20->mode & 0xf000) != 0x4000) goto LAB_004285a9;
        pvVar12 = a->format->data;
        if (*(long *)((long)pvVar12 + 0xe0) != 0) {
          __archive_read_consume(a,*(long *)((long)pvVar12 + 0xe0));
          *(undefined8 *)((long)pvVar12 + 0xe0) = 0;
        }
        uVar37 = *(ulong *)((long)pvVar12 + 0xa0);
        uVar13 = pfVar20->offset;
        if (uVar13 < uVar37) {
          archive_set_error(&a->archive,-1,"Ignoring out-of-order directory (%s) %jd > %jd",
                            (pfVar20->name).s);
LAB_004285eb:
          local_80 = 0xffffffec;
        }
        else {
          local_80 = pfVar20->size + uVar13;
          if (*(ulong *)((long)pvVar12 + 0xb0) < local_80) {
            archive_set_error(&a->archive,-1,"Directory is beyond end-of-media: %s",
                              (pfVar20->name).s);
            goto LAB_004285eb;
          }
          if (uVar13 < uVar37 || uVar13 - uVar37 == 0) {
LAB_0042865b:
            uVar37 = (pfVar20->size + *(ulong *)((long)pvVar12 + 0xa8)) - 1;
            min = uVar37 - uVar37 % *(ulong *)((long)pvVar12 + 0xa8);
            isodirrec = (byte *)__archive_read_ahead(a,min,(ssize_t *)0x0);
            if (isodirrec == (byte *)0x0) {
              archive_set_error(&a->archive,-1,
                                "Failed to read full block when scanning ISO9660 directory list");
LAB_00428b11:
              local_80 = 0xffffffe2;
            }
            else {
              *(long *)((long)pvVar12 + 0xa0) = *(long *)((long)pvVar12 + 0xa0) + min;
              if (min != 0) {
                local_40 = (heap_queue *)((long)pvVar12 + 0x70);
                local_78 = (file_info *)0x0;
                sVar27 = min;
                do {
                  local_38 = sVar27;
                  lVar17 = *(long *)((long)pvVar12 + 0xa8);
                  pbVar21 = isodirrec + lVar17;
                  if ((((ulong)*isodirrec != 0) && (0 < lVar17)) &&
                     ((long)(ulong)*isodirrec <= lVar17)) {
                    do {
                      if ((isodirrec[0x20] != 1) || (iVar36 = 6, 1 < isodirrec[0x21])) {
                        pfVar22 = parse_file_info(a,pfVar20,isodirrec);
                        if (pfVar22 == (file_info *)0x0) {
                          __archive_read_consume(a,min);
LAB_00428798:
                          local_80 = 0xffffffe2;
                          iVar36 = 1;
                        }
                        else {
                          if ((pfVar22->cl_offset == 0) &&
                             ((iVar36 = pfVar22->multi_extent, iVar36 != 0 ||
                              (local_78 != (file_info *)0x0)))) {
                            if (local_78 == (file_info *)0x0) {
                              (pfVar22->contents).first = (content *)0x0;
                              (pfVar22->contents).last = &(pfVar22->contents).first;
                              local_78 = pfVar22;
                            }
                            pcVar23 = (content *)malloc(0x18);
                            if (pcVar23 == (content *)0x0) {
                              bVar38 = false;
                              archive_set_error(&a->archive,0xc,"No memory for multi extent");
                              __archive_read_consume(a,min);
                              local_80 = 0xffffffe2;
                            }
                            else {
                              uVar10 = pfVar22->offset;
                              pcVar23->offset = uVar10;
                              uVar14 = pfVar22->size;
                              pcVar23->size = uVar14;
                              pcVar23->next = (content *)0x0;
                              *(local_78->contents).last = pcVar23;
                              (local_78->contents).last = &pcVar23->next;
                              if (local_78 == pfVar22) {
                                iVar36 = heap_add_entry(a,local_40,pfVar22,uVar10);
                                bVar38 = iVar36 == 0;
                                local_80 = local_80 & 0xffffffff;
                                if (!bVar38) {
                                  local_80 = 0xffffffe2;
                                }
                              }
                              else {
                                local_78->size = local_78->size + uVar14;
                                if (iVar36 == 0) {
                                  local_78 = (file_info *)0x0;
                                }
                                bVar38 = true;
                              }
                            }
                            iVar36 = 1;
                            if (!bVar38) goto LAB_004288c4;
                          }
                          else {
                            iVar36 = heap_add_entry(a,local_40,pfVar22,pfVar22->offset);
                            if (iVar36 != 0) goto LAB_00428798;
                          }
                          iVar36 = 0;
                        }
                      }
LAB_004288c4:
                      if ((iVar36 != 6) && (iVar36 != 0)) goto LAB_004285f0;
                      pbVar6 = isodirrec + *isodirrec;
                    } while (((ulong)*pbVar6 != 0) &&
                            ((isodirrec = isodirrec + *isodirrec, isodirrec < pbVar21 &&
                             (isodirrec + *pbVar6 <= pbVar21))));
                  }
                  sVar27 = local_38 - lVar17;
                  isodirrec = pbVar21;
                } while (sVar27 != 0);
              }
              __archive_read_consume(a,min);
              local_80 = 0;
              if (*(int *)((long)pvVar12 + 0x40) != 0) {
                uVar37 = *(ulong *)((long)pvVar12 + 0xa8);
                do {
                  if (**(long **)((long)pvVar12 + 0x38) != *(long *)((long)pvVar12 + 0xa0)) break;
                  pvVar24 = __archive_read_ahead(a,uVar37,(ssize_t *)0x0);
                  if (pvVar24 == (void *)0x0) {
                    iVar36 = -1;
                    fmt = "Failed to read full block when scanning ISO9660 directory list";
LAB_00428ba1:
                    archive_set_error(&a->archive,iVar36,fmt);
                    goto LAB_00428b11;
                  }
                  do {
                    puVar15 = *(undefined8 **)((long)pvVar12 + 0x38);
                    pfVar22 = (file_info *)puVar15[1];
                    uVar8 = pfVar22->ce_offset;
                    uVar9 = pfVar22->ce_size;
                    if (uVar37 < uVar9 + uVar8) {
                      iVar36 = 0x54;
                      fmt = "Malformed CE information";
                      goto LAB_00428ba1;
                    }
                    if (0 < *(int *)((long)pvVar12 + 0x40)) {
                      uVar30 = *(int *)((long)pvVar12 + 0x40) - 1;
                      *(uint *)((long)pvVar12 + 0x40) = uVar30;
                      uVar19 = (puVar15 + (ulong)uVar30 * 2)[1];
                      *puVar15 = puVar15[(ulong)uVar30 * 2];
                      puVar15[1] = uVar19;
                      iVar36 = *(int *)((long)pvVar12 + 0x40);
                      if (1 < iVar36) {
                        uVar13 = **(ulong **)((long)pvVar12 + 0x38);
                        iVar33 = 0;
                        iVar32 = 1;
                        iVar35 = 0;
                        do {
                          lVar17 = *(long *)((long)pvVar12 + 0x38);
                          uVar29 = *(ulong *)(lVar17 + (long)iVar32 * 0x10);
                          iVar33 = iVar33 + 2;
                          iVar31 = iVar32;
                          if ((iVar33 < iVar36) &&
                             (uVar16 = *(ulong *)(lVar17 + (long)iVar33 * 0x10), uVar16 < uVar29)) {
                            uVar29 = uVar16;
                            iVar31 = iVar33;
                          }
                          if (uVar13 <= uVar29) break;
                          puVar15 = (undefined8 *)(lVar17 + (long)iVar35 * 0x10);
                          local_58 = (file_info *)*puVar15;
                          appfStack_50[0] = (file_info **)puVar15[1];
                          iVar32 = iVar31 * 2 + 1;
                          puVar15 = (undefined8 *)(lVar17 + (long)iVar31 * 0x10);
                          uVar19 = puVar15[1];
                          puVar7 = (undefined8 *)(lVar17 + (long)iVar35 * 0x10);
                          *puVar7 = *puVar15;
                          puVar7[1] = uVar19;
                          puVar15 = (undefined8 *)
                                    (*(long *)((long)pvVar12 + 0x38) + (long)iVar31 * 0x10);
                          *puVar15 = local_58;
                          puVar15[1] = appfStack_50[0];
                          iVar33 = iVar31 * 2;
                          iVar36 = *(int *)((long)pvVar12 + 0x40);
                          iVar35 = iVar31;
                        } while (iVar32 < iVar36);
                      }
                    }
                    p = (uchar *)((ulong)uVar8 + (long)pvVar24);
                    iVar36 = parse_rockridge(a,pfVar22,p,p + uVar9);
                    if (iVar36 != 0) goto LAB_00428b11;
                  } while ((*(int *)((long)pvVar12 + 0x40) != 0) &&
                          (**(long **)((long)pvVar12 + 0x38) == *(long *)((long)pvVar12 + 0xa0)));
                  __archive_read_consume(a,uVar37);
                  *(long *)((long)pvVar12 + 0xa0) = *(long *)((long)pvVar12 + 0xa0) + uVar37;
                } while (*(int *)((long)pvVar12 + 0x40) != 0);
                local_80 = 0;
              }
            }
          }
          else {
            local_80 = __archive_read_consume(a,uVar13 - uVar37);
            if (-1 < (long)local_80) {
              *(uint64_t *)((long)pvVar12 + 0xa0) = pfVar20->offset;
              goto LAB_0042865b;
            }
          }
        }
LAB_004285f0:
        if ((uint)local_80 == 0) {
          if (pfVar20->rr_moved == '\0') {
            if (pfVar20->re != '\0') {
              pfVar20->re_next = (file_info *)0x0;
              *(iso9660->re_files).last = pfVar20;
              (iso9660->re_files).last = &pfVar20->re_next;
              goto LAB_00428add;
            }
            pfVar22 = pfVar20;
            if (pfVar20->re_descendant != '\0') {
              do {
                pfVar22 = pfVar22->parent;
                if (pfVar22 == (file_info *)0x0) goto LAB_00428625;
              } while (pfVar22->re == '\0');
              pfVar20->re_next = (file_info *)0x0;
              *(pfVar22->rede_files).last = pfVar20;
              (pfVar22->rede_files).last = &pfVar20->re_next;
              if (pfVar22 != (file_info *)0x0) {
                bVar38 = false;
                cVar28 = '\x03';
                goto LAB_00428ae4;
              }
            }
          }
          else if (pfVar20->rr_moved_has_re_only != '\0') {
LAB_00428add:
            cVar28 = '\x03';
            bVar38 = false;
            goto LAB_00428ae4;
          }
LAB_00428625:
          cVar28 = '\0';
          bVar38 = true;
        }
        else {
          cVar28 = '\x01';
          bVar38 = false;
          local_84 = (uint)local_80;
        }
LAB_00428ae4:
        if (!bVar38) goto LAB_004285ae;
      }
      else {
        pfVar22 = (file_info *)0x0;
        while( true ) {
          pfVar11 = paVar3->first;
          if ((pfVar11 != (file_info *)0x0) &&
             (pfVar34 = pfVar11->re_next, paVar3->first = pfVar34, pfVar34 == (file_info *)0x0)) {
            (iso9660->re_files).last = &paVar3->first;
          }
          bVar26 = 1;
          if (pfVar11 == pfVar22) goto LAB_0042859b;
          if (pfVar11->offset == uVar10) break;
          if (pfVar22 == (file_info *)0x0) {
            pfVar22 = pfVar11;
          }
          pfVar11->re_next = (file_info *)0x0;
          *(iso9660->re_files).last = pfVar11;
          (iso9660->re_files).last = &pfVar11->re_next;
        }
        piVar1 = &pfVar11->parent->subdirs;
        *piVar1 = *piVar1 + -1;
        pfVar22 = pfVar20->parent;
        pfVar11->parent = pfVar22;
        pfVar11->re = '\0';
        if (pfVar22->re_descendant == '\0') {
          *pfile = pfVar11;
          pfVar22 = (pfVar11->rede_files).first;
          bVar38 = pfVar22 == (file_info *)0x0;
          pfVar20 = pfVar11;
          if (!bVar38) {
            paVar4 = &pfVar11->rede_files;
            do {
              pfVar34 = pfVar22->re_next;
              paVar4->first = pfVar34;
              if (pfVar34 == (file_info *)0x0) {
                (pfVar11->rede_files).last = &paVar4->first;
              }
              if (bVar38) break;
              pfVar22->next = (file_info *)0x0;
              *(iso9660->cache_files).last = pfVar22;
              (iso9660->cache_files).last = &pfVar22->next;
              pfVar22 = paVar4->first;
              bVar38 = pfVar22 == (file_info *)0x0;
            } while (!bVar38);
          }
LAB_0042859b:
          cVar28 = (bVar26 ^ 1) * '\x03';
        }
        else {
          pfVar11->re_descendant = '\x01';
          pfVar22 = pfVar11;
          do {
            pfVar22 = pfVar22->parent;
            cVar28 = '\n';
            if (pfVar22 == (file_info *)0x0) goto LAB_00428537;
          } while (pfVar22->re == '\0');
          pfVar11->re_next = (file_info *)0x0;
          *(pfVar22->rede_files).last = pfVar11;
          (pfVar22->rede_files).last = &pfVar11->re_next;
          if (pfVar22 == (file_info *)0x0) {
LAB_00428537:
            bVar26 = 0;
          }
          else {
            paVar4 = &pfVar11->rede_files;
            do {
              pfVar22 = paVar4->first;
              if (pfVar22 == (file_info *)0x0) {
LAB_00428b7f:
                bVar26 = 0;
                goto LAB_0042859b;
              }
              pfVar34 = pfVar22->re_next;
              paVar4->first = pfVar34;
              if (pfVar34 == (file_info *)0x0) {
                (pfVar11->rede_files).last = &paVar4->first;
              }
              pfVar34 = pfVar22;
              if (pfVar22 == (file_info *)0x0) goto LAB_00428b7f;
              do {
                pfVar34 = pfVar34->parent;
                if (pfVar34 == (file_info *)0x0) goto LAB_00428537;
              } while (pfVar34->re == '\0');
              bVar26 = 0;
              pfVar22->re_next = (file_info *)0x0;
              *(pfVar34->rede_files).last = pfVar22;
              (pfVar34->rede_files).last = &pfVar22->re_next;
            } while (pfVar34 != (file_info *)0x0);
          }
        }
        if (bVar26 == 0) goto LAB_004285ae;
      }
LAB_004285a9:
      cVar28 = '\x02';
    }
LAB_004285ae:
  } while (cVar28 == '\x03');
  if (cVar28 == '\n') {
    archive_set_error(&a->archive,-1,
                      "Failed to connect \'CL\' pointer to \'RE\' rr_moved pointer of Rockridge extensions: current position = %jd, CL offset = %jd"
                      ,iso9660->current_position,pfVar20->cl_offset);
    local_84 = 0xffffffe2;
  }
  else if (((cVar28 == '\x02') && (local_84 = 0, (pfVar20->mode & 0xf000) == 0x8000)) &&
          (lVar17 = pfVar20->number, lVar17 != -1)) {
    iVar36 = 0;
    (iso9660->cache_files).first = (file_info *)0x0;
    pppfVar5 = &(iso9660->cache_files).last;
    (iso9660->cache_files).last = &paVar2->first;
    local_58 = (file_info *)0x0;
    appfStack_50[0] = &local_58;
    if (0 < (iso9660->pending_files).used) {
      iVar36 = 0;
      do {
        lVar18 = (*heap->files)->number;
        if ((lVar18 != -1) && (lVar18 != lVar17)) break;
        bVar38 = pfVar20->number != -1;
        pppfVar25 = pppfVar5;
        if (!bVar38) {
          pppfVar25 = appfStack_50;
        }
        iVar36 = iVar36 + (uint)bVar38;
        pfVar20->next = (file_info *)0x0;
        **pppfVar25 = pfVar20;
        *pppfVar25 = &pfVar20->next;
        pfVar20 = heap_get_entry(heap);
      } while (0 < (iso9660->pending_files).used);
    }
    if (iVar36 == 0) {
      *pfile = pfVar20;
      local_84 = (uint)(pfVar20 == (file_info *)0x0);
    }
    else {
      bVar38 = pfVar20->number != -1;
      pppfVar25 = appfStack_50;
      if (bVar38) {
        pppfVar25 = pppfVar5;
      }
      iVar36 = iVar36 + (uint)bVar38;
      pfVar20->next = (file_info *)0x0;
      **pppfVar25 = pfVar20;
      *pppfVar25 = &pfVar20->next;
      if (1 < iVar36) {
        for (pfVar20 = paVar2->first; pfVar20 != (file_info *)0x0; pfVar20 = pfVar20->next) {
          pfVar20->nlinks = iVar36;
        }
      }
      if (local_58 != (file_info *)0x0) {
        **pppfVar5 = local_58;
        *pppfVar5 = appfStack_50[0];
      }
      pfVar20 = paVar2->first;
      if ((pfVar20 != (file_info *)0x0) &&
         (pfVar22 = pfVar20->next, paVar2->first = pfVar22, pfVar22 == (file_info *)0x0)) {
        *pppfVar5 = &paVar2->first;
      }
      local_84 = (uint)(pfVar20 == (file_info *)0x0);
      *pfile = pfVar20;
    }
  }
  return local_84;
}

Assistant:

static int
next_cache_entry(struct archive_read *a, struct iso9660 *iso9660,
    struct file_info **pfile)
{
	struct file_info *file;
	struct {
		struct file_info	*first;
		struct file_info	**last;
	}	empty_files;
	int64_t number;
	int count;

	file = cache_get_entry(iso9660);
	if (file != NULL) {
		*pfile = file;
		return (ARCHIVE_OK);
	}

	for (;;) {
		struct file_info *re, *d;

		*pfile = file = next_entry(iso9660);
		if (file == NULL) {
			/*
			 * If directory entries all which are descendant of
			 * rr_moved are stil remaning, expose their. 
			 */
			if (iso9660->re_files.first != NULL && 
			    iso9660->rr_moved != NULL &&
			    iso9660->rr_moved->rr_moved_has_re_only)
				/* Expose "rr_moved" entry. */
				cache_add_entry(iso9660, iso9660->rr_moved);
			while ((re = re_get_entry(iso9660)) != NULL) {
				/* Expose its descendant dirs. */
				while ((d = rede_get_entry(re)) != NULL)
					cache_add_entry(iso9660, d);
			}
			if (iso9660->cache_files.first != NULL)
				return (next_cache_entry(a, iso9660, pfile));
			return (ARCHIVE_EOF);
		}

		if (file->cl_offset) {
			struct file_info *first_re = NULL;
			int nexted_re = 0;

			/*
			 * Find "RE" dir for the current file, which
			 * has "CL" flag.
			 */
			while ((re = re_get_entry(iso9660))
			    != first_re) {
				if (first_re == NULL)
					first_re = re;
				if (re->offset == file->cl_offset) {
					re->parent->subdirs--;
					re->parent = file->parent;
					re->re = 0;
					if (re->parent->re_descendant) {
						nexted_re = 1;
						re->re_descendant = 1;
						if (rede_add_entry(re) < 0)
							goto fatal_rr;
						/* Move a list of descendants
						 * to a new ancestor. */
						while ((d = rede_get_entry(
						    re)) != NULL)
							if (rede_add_entry(d)
							    < 0)
								goto fatal_rr;
						break;
					}
					/* Replace the current file
					 * with "RE" dir */
					*pfile = file = re;
					/* Expose its descendant */
					while ((d = rede_get_entry(
					    file)) != NULL)
						cache_add_entry(
						    iso9660, d);
					break;
				} else
					re_add_entry(iso9660, re);
			}
			if (nexted_re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				continue;
			}
		} else if ((file->mode & AE_IFMT) == AE_IFDIR) {
			int r;

			/* Read file entries in this dir. */
			r = read_children(a, file);
			if (r != ARCHIVE_OK)
				return (r);

			/*
			 * Handle a special dir of Rockridge extensions,
			 * "rr_moved".
			 */
			if (file->rr_moved) {
				/*
				 * If this has only the subdirectories which
				 * have "RE" flags, do not expose at this time.
				 */
				if (file->rr_moved_has_re_only)
					continue;
				/* Otherwise expose "rr_moved" entry. */
			} else if (file->re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				re_add_entry(iso9660, file);
				continue;
			} else if (file->re_descendant) {
				/*
				 * If the top level "RE" entry of this entry
				 * is not exposed, we, accordingly, should not
				 * expose this entry at this time because
				 * we cannot make its proper full-path name.
				 */
				if (rede_add_entry(file) == 0)
					continue;
				/* Otherwise we can expose this entry because
				 * it seems its top level "RE" has already been
				 * exposed. */
			}
		}
		break;
	}

	if ((file->mode & AE_IFMT) != AE_IFREG || file->number == -1)
		return (ARCHIVE_OK);

	count = 0;
	number = file->number;
	iso9660->cache_files.first = NULL;
	iso9660->cache_files.last = &(iso9660->cache_files.first);
	empty_files.first = NULL;
	empty_files.last = &empty_files.first;
	/* Collect files which has the same file serial number.
	 * Peek pending_files so that file which number is different
	 * is not put bak. */
	while (iso9660->pending_files.used > 0 &&
	    (iso9660->pending_files.files[0]->number == -1 ||
	     iso9660->pending_files.files[0]->number == number)) {
		if (file->number == -1) {
			/* This file has the same offset
			 * but it's wrong offset which empty files
			 * and symlink files have.
			 * NOTE: This wrong offse was recorded by
			 * old mkisofs utility. If ISO images is
			 * created by latest mkisofs, this does not
			 * happen.
			 */
			file->next = NULL;
			*empty_files.last = file;
			empty_files.last = &(file->next);
		} else {
			count++;
			cache_add_entry(iso9660, file);
		}
		file = next_entry(iso9660);
	}

	if (count == 0) {
		*pfile = file;
		return ((file == NULL)?ARCHIVE_EOF:ARCHIVE_OK);
	}
	if (file->number == -1) {
		file->next = NULL;
		*empty_files.last = file;
		empty_files.last = &(file->next);
	} else {
		count++;
		cache_add_entry(iso9660, file);
	}

	if (count > 1) {
		/* The count is the same as number of hardlink,
		 * so much so that each nlinks of files in cache_file
		 * is overwritten by value of the count.
		 */
		for (file = iso9660->cache_files.first;
		    file != NULL; file = file->next)
			file->nlinks = count;
	}
	/* If there are empty files, that files are added
	 * to the tail of the cache_files. */
	if (empty_files.first != NULL) {
		*iso9660->cache_files.last = empty_files.first;
		iso9660->cache_files.last = empty_files.last;
	}
	*pfile = cache_get_entry(iso9660);
	return ((*pfile == NULL)?ARCHIVE_EOF:ARCHIVE_OK);

fatal_rr:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Failed to connect 'CL' pointer to 'RE' rr_moved pointer of "
	    "Rockridge extensions: current position = %jd, CL offset = %jd",
	    (intmax_t)iso9660->current_position, (intmax_t)file->cl_offset);
	return (ARCHIVE_FATAL);
}